

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcStreamReader.cpp
# Opt level: O2

void HEVCStreamReader::storeBuffer(MemoryBlock *dst,uint8_t *data,uint8_t *dataEnd)

{
  uint8_t *puVar1;
  pointer puVar2;
  uint8_t *puVar3;
  size_t __n;
  pointer __dest;
  
  puVar3 = dataEnd + -1;
  __n = (long)dataEnd - (long)data;
  do {
    if (puVar3 <= data) {
      return;
    }
    __n = __n - 1;
    puVar1 = puVar3 + -1;
    puVar3 = puVar3 + -1;
  } while (*puVar1 == '\0');
  MemoryBlock::resize(dst,(uint)__n);
  puVar2 = (dst->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  __dest = (pointer)0x0;
  if (puVar2 != (dst->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    __dest = puVar2;
  }
  memcpy(__dest,data,__n);
  return;
}

Assistant:

void HEVCStreamReader::storeBuffer(MemoryBlock& dst, const uint8_t* data, const uint8_t* dataEnd)
{
    dataEnd--;
    while (dataEnd > data && dataEnd[-1] == 0) dataEnd--;
    if (dataEnd > data)
    {
        dst.resize(static_cast<int>(dataEnd - data));
        memcpy(dst.data(), data, dataEnd - data);
    }
}